

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O1

ScalarFunction * duckdb::AliasFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_99;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  LogicalType local_78 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_30,ANY);
  __l._M_len = 1;
  __l._M_array = local_30;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_99);
  duckdb::LogicalType::LogicalType(local_78,VARCHAR);
  uStack_90 = 0;
  local_98 = AliasFunction;
  pcStack_80 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_48);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  duckdb::LogicalType::~LogicalType(local_78);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  duckdb::LogicalType::~LogicalType(local_30);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction AliasFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY}, LogicalType::VARCHAR, AliasFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}